

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::crate::CrateReader::GetSpecString_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CrateReader *this,Index index)

{
  ulong uVar1;
  uint __val;
  pointer pSVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  long *plVar10;
  SpecType ty;
  uint uVar11;
  ulong uVar12;
  string path_str;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pathv;
  string __str;
  string specty_str;
  long *local_160;
  undefined8 local_158;
  long local_150;
  undefined8 uStack_148;
  undefined1 local_140 [24];
  undefined1 local_128 [16];
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  ulong *local_f8;
  undefined8 local_f0;
  ulong local_e8;
  long lStack_e0;
  char local_d8;
  anon_struct_8_0_00000001_for___align local_d0;
  size_type local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = (ulong)index.value;
  pSVar2 = (this->_specs).
           super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar12 = ((long)(this->_specs).
                  super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 2) *
           -0x5555555555555555;
  if (uVar12 < uVar1 || uVar12 - uVar1 == 0) {
LAB_001a41d4:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    return __return_storage_ptr__;
  }
  GetPathString_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_140,this,(Index)pSVar2[uVar1].path_index.value);
  local_d8 = local_140[0];
  if (local_140[0] == true) {
    local_d0 = (anon_struct_8_0_00000001_for___align)&local_c0;
    if ((undefined1 *)local_140._8_8_ == local_128) {
      uStack_b8 = local_128._8_8_;
    }
    else {
      local_d0 = (anon_struct_8_0_00000001_for___align)local_140._8_8_;
    }
    local_c0 = CONCAT71(local_128._1_7_,local_128[0]);
    local_c8 = local_140._16_8_;
    local_140._16_8_ = 0;
    local_128[0] = '\0';
    local_140._8_8_ = local_128;
  }
  if (local_140[0] != true) goto LAB_001a41d4;
  local_140._0_8_ = local_140 + 0x10;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_140,local_d0,local_c8 + (long)local_d0);
  tinyusdz::to_string_abi_cxx11_(&local_70,(tinyusdz *)(ulong)pSVar2[uVar1].spec_type,ty);
  ::std::operator+(&local_50,"[Spec] path: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_50);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_108 = *puVar9;
    lStack_100 = plVar7[3];
    local_118 = &local_108;
  }
  else {
    local_108 = *puVar9;
    local_118 = (ulong *)*plVar7;
  }
  local_110 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  __val = pSVar2[uVar1].fieldset_index.value;
  cVar6 = '\x01';
  if (9 < __val) {
    uVar11 = __val;
    cVar5 = '\x04';
    do {
      cVar6 = cVar5;
      if (uVar11 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_001a4268;
      }
      if (uVar11 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_001a4268;
      }
      if (uVar11 < 10000) goto LAB_001a4268;
      bVar4 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar5 = cVar6 + '\x04';
    } while (bVar4);
    cVar6 = cVar6 + '\x01';
  }
LAB_001a4268:
  local_b0 = local_a0;
  ::std::__cxx11::string::_M_construct((ulong)&local_b0,cVar6);
  ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,local_a8,__val);
  uVar1 = CONCAT44(uStack_a4,local_a8) + local_110;
  uVar12 = 0xf;
  if (local_118 != &local_108) {
    uVar12 = local_108;
  }
  if (uVar12 < uVar1) {
    uVar12 = 0xf;
    if (local_b0 != local_a0) {
      uVar12 = local_a0[0];
    }
    if (uVar1 <= uVar12) {
      puVar8 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_118);
      goto LAB_001a42fd;
    }
  }
  puVar8 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_b0);
LAB_001a42fd:
  local_160 = &local_150;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_150 = *plVar7;
    uStack_148 = puVar8[3];
  }
  else {
    local_150 = *plVar7;
    local_160 = (long *)*puVar8;
  }
  local_158 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_160);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_80 = *plVar10;
    lStack_78 = plVar7[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar10;
    local_90 = (long *)*plVar7;
  }
  local_88 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_e8 = *puVar9;
    lStack_e0 = plVar7[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *puVar9;
    local_f8 = (ulong *)*plVar7;
  }
  lVar3 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  __return_storage_ptr__->has_value_ = true;
  puVar9 = (ulong *)((long)&__return_storage_ptr__->contained + 0x10);
  *(ulong **)&__return_storage_ptr__->contained = puVar9;
  if (local_f8 == &local_e8) {
    *puVar9 = local_e8;
    *(long *)((long)&__return_storage_ptr__->contained + 0x18) = lStack_e0;
  }
  else {
    *(ulong **)&__return_storage_ptr__->contained = local_f8;
    *(ulong *)((long)&__return_storage_ptr__->contained + 0x10) = local_e8;
  }
  *(long *)((long)&__return_storage_ptr__->contained + 8) = lVar3;
  local_f0 = 0;
  local_e8 = local_e8 & 0xffffffffffffff00;
  local_f8 = &local_e8;
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if (local_d8 != '\x01') {
    return __return_storage_ptr__;
  }
  if (local_d0 == (anon_struct_8_0_00000001_for___align)&local_c0) {
    return __return_storage_ptr__;
  }
  operator_delete((void *)local_d0,local_c0 + 1);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<std::string> CrateReader::GetSpecString(
    crate::Index index) const {
  if (index.value < _specs.size()) {
    // ok
  } else {
    return nonstd::nullopt;
  }

  const crate::Spec &spec = _specs[index.value];

  if (auto pathv = GetPathString(spec.path_index)) {
    std::string path_str = pathv.value();
    std::string specty_str = to_string(spec.spec_type);

    return "[Spec] path: " + path_str +
           ", fieldset id: " + std::to_string(spec.fieldset_index.value) +
           ", spec_type: " + specty_str;
  }

  return nonstd::nullopt;
}